

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

void Gia_ObjComputeTruthTableStop(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  Vec_Ptr_t *__ptr;
  Vec_Wrd_t *__ptr_00;
  
  p->nTtVars = 0;
  p->nTtWords = 0;
  pVVar1 = p->vTtNums;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vTtNums->pArray = (int *)0x0;
      pVVar1 = p->vTtNums;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0023aeb3;
    }
    free(pVVar1);
    p->vTtNums = (Vec_Int_t *)0x0;
  }
LAB_0023aeb3:
  pVVar1 = p->vTtNodes;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    if (pVVar1->pArray != (int *)0x0) {
      free(pVVar1->pArray);
      p->vTtNodes->pArray = (int *)0x0;
      pVVar1 = p->vTtNodes;
      if (pVVar1 == (Vec_Int_t *)0x0) goto LAB_0023aefb;
    }
    free(pVVar1);
    p->vTtNodes = (Vec_Int_t *)0x0;
  }
LAB_0023aefb:
  __ptr = p->vTtInputs;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      p->vTtInputs->pArray = (void **)0x0;
      __ptr = p->vTtInputs;
      if (__ptr == (Vec_Ptr_t *)0x0) goto LAB_0023af43;
    }
    free(__ptr);
    p->vTtInputs = (Vec_Ptr_t *)0x0;
  }
LAB_0023af43:
  __ptr_00 = p->vTtMemory;
  if (__ptr_00 != (Vec_Wrd_t *)0x0) {
    if (__ptr_00->pArray != (word *)0x0) {
      free(__ptr_00->pArray);
      p->vTtMemory->pArray = (word *)0x0;
      __ptr_00 = p->vTtMemory;
      if (__ptr_00 == (Vec_Wrd_t *)0x0) {
        return;
      }
    }
    free(__ptr_00);
    p->vTtMemory = (Vec_Wrd_t *)0x0;
  }
  return;
}

Assistant:

void Gia_ObjComputeTruthTableStop( Gia_Man_t * p )
{
    p->nTtVars   = 0;
    p->nTtWords  = 0;
    Vec_IntFreeP( &p->vTtNums );
    Vec_IntFreeP( &p->vTtNodes );
    Vec_PtrFreeP( &p->vTtInputs );
    Vec_WrdFreeP( &p->vTtMemory );
}